

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O1

SourceRange __thiscall slang::syntax::DeferredSourceRange::get(DeferredSourceRange *this)

{
  SyntaxNode *this_00;
  SourceRange SVar1;
  
  this_00 = (SyntaxNode *)(this->node).value;
  if (((ulong)this_00 & 1) == 0) {
    if (this_00 != (SyntaxNode *)0x0) {
      SVar1 = SyntaxNode::sourceRange(this_00);
      this->range = SVar1;
    }
    *(byte *)&(this->node).value = (byte)(this->node).value | 1;
  }
  return this->range;
}

Assistant:

SourceRange get() const {
        if (!node.getInt()) {
            if (auto ptr = node.getPointer())
                range = ptr->sourceRange();
            node.setInt(true);
        }
        return range;
    }